

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

void __thiscall
IMLE<1,_1,_FastLinearExpert>::clusterForwardSolutions
          (IMLE<1,_1,_FastLinearExpert> *this,int newSol1,int newSol2,int worseSol)

{
  int *y;
  int iVar1;
  double *pdVar2;
  pointer pMVar3;
  ulong uVar4;
  int k_1;
  long lVar5;
  int k;
  long lVar6;
  double dVar7;
  Mat sol;
  Mat p;
  ArrayX sumInvRj;
  ArrayX sumInvRxj;
  Matrix<double,__1,__1,_0,__1,__1> local_100;
  Matrix<double,__1,__1,_0,__1,__1> local_e8;
  undefined1 local_d0 [24];
  scalar_constant_op<double> local_b8;
  variable_if_dynamic<long,__1> local_b0;
  variable_if_dynamic<long,__1> local_a8;
  Matrix<double,__1,__1,_0,__1,__1> *local_a0;
  Matrix<double,__1,__1,_0,__1,__1> *local_98;
  ulong local_88;
  ArrayX *local_80;
  int *local_78;
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  local_70;
  Mat *local_58;
  Mat *local_50;
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  local_48;
  
  local_88 = CONCAT44(local_88._4_4_,newSol1);
  local_78 = &this->M;
  y = &this->nSolFound;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_e8,local_78,y);
  local_d0._0_4_ = 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_100,(int *)local_d0,y);
  local_80 = &this->predictions;
  lVar5 = 0;
  for (lVar6 = 0; lVar6 < (long)*y + -1; lVar6 = lVar6 + 1) {
    local_d0._0_8_ =
         local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         + local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows * lVar6;
    local_d0._8_8_ =
         local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
    ;
    local_b8.m_other = (double)&local_100;
    local_b0.m_value = 0;
    local_a0 = (Matrix<double,__1,__1,_0,__1,__1> *)
               local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows;
    local_a8.m_value = lVar6;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,1,1,0,1,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_d0,
               (Matrix<double,_1,_1,_0,_1,_1> *)
               ((long)&(((local_80->
                         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                         ).
                         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage +
               lVar5));
    lVar5 = lVar5 + 8;
  }
  local_a8.m_value = (long)worseSol;
  local_d0._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
       local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       local_a8.m_value;
  local_d0._8_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_b0.m_value = 0;
  local_a0 = (Matrix<double,__1,__1,_0,__1,__1> *)
             local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
  local_b8.m_other = (double)&local_100;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,1,1,0,1,1>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_d0,
             &(this->experts).
              super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              .
              super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(int)local_88].super_LinearExpert<1,_1>.
              pred_x);
  local_a8.m_value = (long)this->nSolFound + -1;
  local_d0._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
       local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       local_a8.m_value;
  local_d0._8_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_b0.m_value = 0;
  local_a0 = (Matrix<double,__1,__1,_0,__1,__1> *)
             local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
  local_b8.m_other = (double)&local_100;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,1,1,0,1,1>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_d0,
             &(this->experts).
              super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              .
              super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[newSol2].super_LinearExpert<1,_1>.pred_x);
  local_50 = &this->fInvRj;
  local_58 = &this->invRxj;
  uVar4 = 0;
  while ((int)uVar4 < (this->param).iterMax) {
    local_88 = uVar4;
    for (lVar5 = 0; lVar5 < *local_78; lVar5 = lVar5 + 1) {
      for (lVar6 = 0; lVar6 < *y; lVar6 = lVar6 + 1) {
        local_d0._8_8_ =
             local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data + local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows * lVar6;
        local_d0._0_8_ =
             &(this->experts).
              super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              .
              super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar5].super_LinearExpert<1,_1>.pred_x;
        local_d0._16_8_ =
             local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
        local_b0.m_value = (long)&local_100;
        local_a8.m_value = 0;
        local_98 = (Matrix<double,__1,__1,_0,__1,__1> *)
                   local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
        local_a0 = (Matrix<double,__1,__1,_0,__1,__1> *)lVar6;
        Eigen::PlainObjectBase<Eigen::Matrix<double,1,1,0,1,1>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,1,1,0,1,1>> *)&local_70,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                    *)local_d0);
        dVar7 = exp((this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data
                    [(this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                     .m_storage.m_rows * lVar5] *
                    (double)local_70.
                            super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                            .
                            super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start *
                    (double)local_70.
                            super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                            .
                            super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start * -0.5);
        local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        [local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
         * lVar6 + lVar5] = dVar7;
      }
      local_d0._0_8_ =
           local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data + lVar5;
      local_d0._16_8_ =
           local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      local_b8.m_other = (double)&local_e8;
      local_a8.m_value = 0;
      local_a0 = (Matrix<double,__1,__1,_0,__1,__1> *)0x1;
      local_b0.m_value = lVar5;
      local_70.
      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)Eigen::
                    DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
                    ::sum((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                           *)local_d0);
      if (0.0 < (double)local_70.
                        super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                        .
                        super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
        local_d0._0_8_ =
             local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data + lVar5;
        local_d0._16_8_ =
             local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
        local_b8.m_other = (double)&local_e8;
        local_a8.m_value = 0;
        local_a0 = (Matrix<double,__1,__1,_0,__1,__1> *)0x1;
        local_b0.m_value = lVar5;
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
        operator/=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                    *)local_d0,(Scalar *)&local_70);
      }
    }
    local_d0._0_8_ = local_58;
    local_d0._8_8_ = &local_e8;
    local_d0._16_8_ = local_50;
    local_b8.m_other = (double)local_d0._8_8_;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const>>
              (&local_100,
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)local_d0);
    uVar4 = (ulong)((int)local_88 + 1);
  }
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(&local_70,(long)this->nSolFound,&this->zeroX);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(&local_48,(long)*y,&this->zeroX);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&(this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)this->nSolFound);
  for (lVar5 = 0; lVar5 < *local_78; lVar5 = lVar5 + 1) {
    local_d0._0_8_ =
         local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         + lVar5;
    local_d0._16_8_ =
         local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
    local_b8.m_other = (double)&local_e8;
    local_a8.m_value = 0;
    local_a0 = (Matrix<double,__1,__1,_0,__1,__1> *)0x1;
    local_b0.m_value = lVar5;
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::maxCoeff<0,int>
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>> *)local_d0,
               (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + lVar5);
    iVar1 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5];
    pdVar2 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    pdVar2[iVar1] =
         (this->experts).
         super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
         .
         super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar5].super_LinearExpert<1,_1>.p_z_T +
         pdVar2[iVar1];
    local_70.
    super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    .
    super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start[iVar1].
    super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
         (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data[(this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows * lVar5] +
         local_70.
         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         .
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start[iVar1].
         super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0];
    local_48.
    super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    .
    super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start[iVar1].
    super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
         (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data[(this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows * lVar5] +
         local_48.
         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         .
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start[iVar1].
         super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0];
  }
  local_d0._8_8_ =
       (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_rows;
  local_b8.m_other = this->pNoiseModelZ;
  local_d0._0_8_ = &this->sum_p_z;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>>
            (&this->sumW,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
              *)local_d0);
  pMVar3 = (this->predictions).
           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->predictions).
      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pMVar3) {
    (this->predictions).
    super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    .
    super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar3;
  }
  for (lVar5 = 0; lVar5 < *y; lVar5 = lVar5 + 1) {
    local_d0._0_8_ =
         local_48.
         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         .
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar5].
         super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] /
         local_70.
         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         .
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar5].
         super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0];
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::push_back(&local_80->
                 super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                ,(value_type *)local_d0);
  }
  free(local_48.
       super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
       .
       super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start);
  free(local_70.
       super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
       .
       super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start);
  free(local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::clusterForwardSolutions(int newSol1, int newSol2, int worseSol)
{
    Mat p(M,nSolFound);
    Mat sol(D,nSolFound);

    // "Educated" guesses for the nSolFound solutions
    for(int k = 0; k < nSolFound-1; k++)
        sol.col(k) = predictions[k];
    // Split worse solution in two
    sol.col(worseSol)    = experts[newSol1].getPredX();
    sol.col(nSolFound-1) = experts[newSol2].getPredX();

    for( int nIter = 0; nIter < param.iterMax; nIter++ )
    {
        // E-Step
        for( int j = 0; j < M; j++ )
        {
            for( int k = 0; k < nSolFound; k++ )
            {
                X dist = experts[j].getPredX() - sol.col(k);
                p(j,k) = exp(-0.5*dist.dot(fInvRj.col(j).asDiagonal()*dist));
            }
            Scal pSum;
            if( (pSum = p.row(j).sum()) > 0.0 )
                p.row(j) /= pSum;
        }
        // M-Step
        sol = (invRxj * p).cwiseQuotient( fInvRj * p );
        /* Here I can easily implement k-means by hard assigning to most probable solution */
    }


    /***** Recalculate (hard-assign) solutions   ******/
    // Aux variables
    ArrayX sumInvRj(nSolFound, zeroX);
    ArrayX sumInvRxj(nSolFound, zeroX);

    sum_p_z.setZero(nSolFound);

    // Hard assign solutions
    for( int j = 0; j < M; j++ )
    {
        p.row(j).maxCoeff(&sNearest[j]);

        sum_p_z(sNearest[j]) += experts[j].get_p_z();
        sumInvRj[sNearest[j]] += fInvRj.col(j);
        sumInvRxj[sNearest[j]] += invRxj.col(j);
    }
    sumW = sum_p_z.array() + pNoiseModelZ;

    // Clear predict data structure
    predictions.clear();

    // Update storage results
    for( int k = 0; k < nSolFound; k++ )
        predictions.push_back( sumInvRxj[k].cwiseQuotient(sumInvRj[k]) );
}